

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void LodePNGIText_cleanup(LodePNGInfo *info)

{
  size_t local_18;
  size_t i;
  LodePNGInfo *info_local;
  
  for (local_18 = 0; local_18 != info->itext_num; local_18 = local_18 + 1) {
    string_cleanup(info->itext_keys + local_18);
    string_cleanup(info->itext_langtags + local_18);
    string_cleanup(info->itext_transkeys + local_18);
    string_cleanup(info->itext_strings + local_18);
  }
  lodepng_free(info->itext_keys);
  lodepng_free(info->itext_langtags);
  lodepng_free(info->itext_transkeys);
  lodepng_free(info->itext_strings);
  return;
}

Assistant:

static void LodePNGIText_cleanup(LodePNGInfo* info)
{
  size_t i;
  for(i = 0; i != info->itext_num; ++i)
  {
    string_cleanup(&info->itext_keys[i]);
    string_cleanup(&info->itext_langtags[i]);
    string_cleanup(&info->itext_transkeys[i]);
    string_cleanup(&info->itext_strings[i]);
  }
  lodepng_free(info->itext_keys);
  lodepng_free(info->itext_langtags);
  lodepng_free(info->itext_transkeys);
  lodepng_free(info->itext_strings);
}